

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     UnaryUpdateLoop<duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,unsigned_long,duckdb::EntropyFunction<duckdb::ModeStandard<unsigned_long>>>
               (unsigned_long *idata,AggregateInputData *aggr_input_data,
               ModeState<unsigned_long,_duckdb::ModeStandard<unsigned_long>_> *state,idx_t count,
               ValidityMask *mask,SelectionVector *sel_vector)

{
  bool bVar1;
  ModeState<unsigned_long,_duckdb::ModeStandard<unsigned_long>_> *in_RCX;
  AggregateInputData *in_RSI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  SelectionVector *in_R9;
  idx_t i_1;
  idx_t i;
  AggregateUnaryInput input;
  unsigned_long *in_stack_ffffffffffffffa8;
  ModeState<unsigned_long,_duckdb::ModeStandard<unsigned_long>_> *pMVar2;
  ModeState<unsigned_long,_duckdb::ModeStandard<unsigned_long>_> *in_stack_ffffffffffffffb0;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffb8;
  
  AggregateUnaryInput::AggregateUnaryInput
            ((AggregateUnaryInput *)&stack0xffffffffffffffb8,in_RSI,(ValidityMask *)in_R8);
  bVar1 = BaseModeFunction<duckdb::ModeStandard<unsigned_long>_>::IgnoreNull();
  if ((!bVar1) || (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_R8), bVar1)) {
    for (pMVar2 = (ModeState<unsigned_long,_duckdb::ModeStandard<unsigned_long>_> *)0x0;
        pMVar2 < in_RCX;
        pMVar2 = (ModeState<unsigned_long,_duckdb::ModeStandard<unsigned_long>_> *)
                 ((long)&(pMVar2->prevs).
                         super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                         super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1)) {
      SelectionVector::get_index(in_R9,(idx_t)pMVar2);
      BaseModeFunction<duckdb::ModeStandard<unsigned_long>>::
      Operation<unsigned_long,duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,duckdb::EntropyFunction<duckdb::ModeStandard<unsigned_long>>>
                (in_stack_ffffffffffffffb0,(unsigned_long *)pMVar2,(AggregateUnaryInput *)0xb3833a);
    }
  }
  else {
    for (pMVar2 = (ModeState<unsigned_long,_duckdb::ModeStandard<unsigned_long>_> *)0x0;
        pMVar2 < in_RCX;
        pMVar2 = (ModeState<unsigned_long,_duckdb::ModeStandard<unsigned_long>_> *)
                 ((long)&(pMVar2->prevs).
                         super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                         super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1)) {
      SelectionVector::get_index(in_R9,(idx_t)pMVar2);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_ffffffffffffffb8,(idx_t)pMVar2);
      if (bVar1) {
        BaseModeFunction<duckdb::ModeStandard<unsigned_long>>::
        Operation<unsigned_long,duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,duckdb::EntropyFunction<duckdb::ModeStandard<unsigned_long>>>
                  (pMVar2,in_stack_ffffffffffffffa8,(AggregateUnaryInput *)0xb382e0);
      }
    }
  }
  return;
}

Assistant:

static inline void UnaryUpdateLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                   STATE_TYPE *__restrict state, idx_t count, ValidityMask &mask,
	                                   const SelectionVector &__restrict sel_vector) {
		AggregateUnaryInput input(aggr_input_data, mask);
		if (OP::IgnoreNull() && !mask.AllValid()) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = sel_vector.get_index(i);
				if (mask.RowIsValid(input.input_idx)) {
					OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[input.input_idx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = sel_vector.get_index(i);
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[input.input_idx], input);
			}
		}
	}